

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O1

string_view cmWindowsRegistry::FromView(View view)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  string_view sVar6;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined4 local_b0 [2];
  undefined8 local_a8;
  char *local_a0;
  undefined4 local_98;
  undefined8 local_90;
  char *local_88;
  undefined4 local_80;
  undefined8 local_78;
  char *local_70;
  undefined4 local_68;
  undefined8 local_60;
  char *local_58;
  undefined4 local_50;
  undefined8 local_48;
  char *local_40;
  undefined4 local_38;
  undefined8 local_30;
  char *local_28;
  undefined4 local_20;
  undefined8 local_18;
  char *local_10;
  
  if ((FromView(cmWindowsRegistry::View)::ViewDefinitions == '\0') &&
     (iVar1 = __cxa_guard_acquire(&FromView(cmWindowsRegistry::View)::ViewDefinitions), iVar1 != 0))
  {
    local_b0[0] = 0;
    local_a8 = 4;
    local_a0 = "BOTH";
    local_98 = 2;
    local_90 = 4;
    local_88 = "HOST";
    local_80 = 1;
    local_78 = 6;
    local_70 = "TARGET";
    local_68 = 5;
    local_60 = 2;
    local_58 = "32";
    local_50 = 6;
    local_48 = 2;
    local_40 = "64";
    local_38 = 4;
    local_30 = 5;
    local_28 = "32_64";
    local_20 = 3;
    local_18 = 5;
    local_10 = "64_32";
    std::
    _Hashtable<cmWindowsRegistry::View,std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<cmWindowsRegistry::View>,std::hash<cmWindowsRegistry::View>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _Hashtable<std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>const*>
              ((_Hashtable<cmWindowsRegistry::View,std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<cmWindowsRegistry::View_const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<cmWindowsRegistry::View>,std::hash<cmWindowsRegistry::View>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&FromView::ViewDefinitions,local_b0,&stack0xfffffffffffffff8,0,&local_b1,&local_b2
               ,&local_b3);
    __cxa_atexit(std::
                 unordered_map<cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<cmWindowsRegistry::View>,_std::equal_to<cmWindowsRegistry::View>,_std::allocator<std::pair<const_cmWindowsRegistry::View,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::~unordered_map,&FromView::ViewDefinitions,&__dso_handle);
    __cxa_guard_release(&FromView(cmWindowsRegistry::View)::ViewDefinitions);
  }
  p_Var4 = FromView::ViewDefinitions._M_h._M_buckets
           [(ulong)(long)(int)view % FromView::ViewDefinitions._M_h._M_bucket_count];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var4->_M_nxt, p_Var5 = p_Var4, *(View *)&p_Var4->_M_nxt[1]._M_nxt != view)) {
    while (p_Var4 = p_Var3, p_Var3 = p_Var4->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)(long)(int)*(View *)&p_Var3[1]._M_nxt %
           FromView::ViewDefinitions._M_h._M_bucket_count !=
           (ulong)(long)(int)view % FromView::ViewDefinitions._M_h._M_bucket_count) ||
         (p_Var5 = p_Var4, *(View *)&p_Var3[1]._M_nxt == view)) goto LAB_006953af;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_006953af:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var5->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    p_Var3 = (_Hash_node_base *)0x9ac4f5;
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var3[2]._M_nxt;
    p_Var3 = p_Var3[3]._M_nxt;
  }
  sVar6._M_str = (char *)p_Var3;
  sVar6._M_len = (size_t)p_Var2;
  return sVar6;
}

Assistant:

cm::string_view cmWindowsRegistry::FromView(View view)
{
  static std::unordered_map<cmWindowsRegistry::View, cm::string_view>
    ViewDefinitions{
      { View::Both, "BOTH"_s },     { View::Host, "HOST"_s },
      { View::Target, "TARGET"_s }, { View::Reg32, "32"_s },
      { View::Reg64, "64"_s },      { View::Reg32_64, "32_64"_s },
      { View::Reg64_32, "64_32"_s }
    };

  auto it = ViewDefinitions.find(view);

  return it == ViewDefinitions.end() ? ""_s : it->second;
}